

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ConstraintSet::calcVelocityError
          (ConstraintSet *this,uint groupIndex,Model *model,VectorNd *Q,VectorNd *QDot,
          VectorNd *velErrUpd,bool updKin)

{
  byte bVar1;
  element_type *peVar2;
  VectorNd *in_RCX;
  VectorNd *in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_R8;
  byte in_stack_00000008;
  VectorNd *in_stack_00000418;
  VectorNd *in_stack_00000420;
  VectorNd *in_stack_00000428;
  Model *in_stack_00000430;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  bVar1 = in_stack_00000008 & 1;
  if (bVar1 != 0) {
    UpdateKinematicsCustom(in_stack_00000430,in_stack_00000428,in_stack_00000420,in_stack_00000418);
  }
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
  ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                *)(in_RDI + 200),(ulong)in_ESI);
  peVar2 = std::
           __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6e1d83);
  (*peVar2->_vptr_Constraint[1])
            (0,peVar2,in_RDX,in_RCX,in_R8,in_RDI + 0x198,in_RDI + 0x620,CONCAT44(uVar3,(uint)bVar1))
  ;
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
  ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                *)(in_RDI + 200),(ulong)in_ESI);
  peVar2 = std::
           __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x6e1de4);
  (*peVar2->_vptr_Constraint[4])
            (0,peVar2,in_RDX,in_RCX,in_R8,in_RDI + 0x198,in_RDI + 0x120,in_RDI + 0x620,(uint)bVar1);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
  ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                *)(in_RDI + 200),(ulong)in_ESI);
  std::__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6e1e54);
  Constraint::getVelocityError
            ((Constraint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX);
  return;
}

Assistant:

void ConstraintSet::calcVelocityError(
  unsigned int groupIndex,
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  Math::VectorNd &velErrUpd,
  bool updKin)
{
  assert(groupIndex <= unsigned(constraints.size()-1));

  if (updKin) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  //Update the constraint Jacobian of this constraint
  constraints[groupIndex]->calcConstraintJacobian(model,0.,Q,QDot,G,cache,
      updKin);

  //Update the velocity-level errors of this constraint
  constraints[groupIndex]->calcVelocityError(model,0.,Q,QDot,G,errd,cache,
      updKin);

  //Pick out the sub vector of velocity errors for this constraint from
  //the system error vector.
  constraints[groupIndex]->getVelocityError(errd,velErrUpd);

}